

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void swrenderer::R_EnterPortal(PortalDrawseg *pds,int depth)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  short *psVar7;
  BYTE *pBVar8;
  PortalDrawseg *pds_00;
  double dVar9;
  double dVar10;
  int prevuniq2;
  uint portalsAtEnd;
  int prevuniq;
  double vzp;
  TFlags local_1b8 [4];
  uint local_1b4;
  undefined8 uStack_1b0;
  int prevmf;
  PortalDrawseg *prevpds;
  double local_190;
  double dist2;
  double local_170;
  double dist1;
  double local_150;
  double distp;
  TVector2<double> local_138;
  TAngle<double> local_128;
  undefined1 local_120 [40];
  double local_f8;
  double r;
  double y_1;
  double x_1;
  double y1;
  double x1;
  double dy;
  double dx;
  vertex_t *v2;
  vertex_t *local_b0;
  undefined1 local_a8 [24];
  vertex_t *v1;
  uint portalsAtStart;
  ActorRenderFlags savedvisibility;
  DVector3 savedpath [2];
  DVector3 startpos;
  DAngle startang;
  sector_t *psStack_30;
  int y;
  BYTE *dest;
  int Ybottom;
  int Ytop;
  int x;
  int spacing;
  BYTE color;
  int depth_local;
  PortalDrawseg *pds_local;
  
  iVar3 = FIntCVar::operator_cast_to_int(&r_portal_recursions);
  if (depth < iVar3) {
    TAngle<double>::TAngle((TAngle<double> *)&startpos.Z,&ViewAngle);
    TVector3<double>::TVector3((TVector3<double> *)&savedpath[1].Z,&ViewPos);
    TVector3<double>::TVector3((TVector3<double> *)&portalsAtStart,ViewPath);
    TVector3<double>::TVector3((TVector3<double> *)&savedpath[0].Z,ViewPath + 1);
    if (camera == (AActor *)0x0) {
      TFlags<ActorRenderFlag,_unsigned_int>::FromInt
                ((TFlags<ActorRenderFlag,_unsigned_int> *)((long)&v1 + 4),0);
    }
    else {
      TFlags<ActorRenderFlag,_unsigned_int>::operator&
                ((TFlags<ActorRenderFlag,_unsigned_int> *)((long)&v1 + 4),(int)camera + 0x10c);
    }
    CurrentPortalUniq = CurrentPortalUniq + 1;
    v1._0_4_ = TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg>::Size
                         ((TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg> *)
                          WallPortals);
    if ((pds->mirror & 1U) == 0) {
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPos.X,&ViewPos.Y);
      P_TranslatePortalZ((line_t_conflict *)pds->src,&ViewPos.Z);
      P_TranslatePortalAngle((line_t_conflict *)pds->src,&ViewAngle);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[0].X,&ViewPath[0].Y);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[1].X,&ViewPath[1].Y);
      bVar2 = false;
      if (((r_showviewer & 1U) == 0) && (bVar2 = false, camera != (AActor *)0x0)) {
        TVector2<double>::TVector2(&local_138,ViewPath);
        iVar3 = P_PointOnLineSidePrecise(&local_138,(line_t_conflict *)pds->dst);
        TVector2<double>::TVector2((TVector2<double> *)&distp,ViewPath + 1);
        iVar4 = P_PointOnLineSidePrecise((DVector2 *)&distp,(line_t_conflict *)pds->dst);
        bVar2 = iVar3 != iVar4;
      }
      if (bVar2) {
        TVector3<double>::operator-((TVector3<double> *)&dist1,ViewPath,ViewPath + 1);
        local_150 = TVector3<double>::Length((TVector3<double> *)&dist1);
        if (1.52587890625e-05 < local_150) {
          TVector3<double>::operator-((TVector3<double> *)&dist2,&ViewPos,ViewPath);
          local_170 = TVector3<double>::Length((TVector3<double> *)&dist2);
          TVector3<double>::operator-((TVector3<double> *)&prevpds,&ViewPos,ViewPath + 1);
          local_190 = TVector3<double>::Length((TVector3<double> *)&prevpds);
          if (local_170 + local_190 < local_150 + 1.0) {
            TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&camera->renderflags,RF_INVISIBLE);
          }
        }
      }
    }
    else {
      local_a8._16_8_ = pds->src->v1;
      line_t::Delta((line_t *)local_a8);
      if (((double)local_a8._0_8_ != 0.0) || (NAN((double)local_a8._0_8_))) {
        line_t::Delta((line_t *)&v2);
        if (((double)local_b0 != 0.0) || (NAN((double)local_b0))) {
          dx = (double)pds->src->v2;
          dVar9 = vertex_t::fX((vertex_t *)dx);
          dVar10 = vertex_t::fX((vertex_t *)local_a8._16_8_);
          dy = dVar9 - dVar10;
          dVar9 = vertex_t::fY((vertex_t *)dx);
          dVar10 = vertex_t::fY((vertex_t *)local_a8._16_8_);
          x1 = dVar9 - dVar10;
          y1 = vertex_t::fX((vertex_t *)local_a8._16_8_);
          x_1 = vertex_t::fY((vertex_t *)local_a8._16_8_);
          y_1 = savedpath[1].Z;
          r = startpos.X;
          local_f8 = ((savedpath[1].Z - y1) * dy + (startpos.X - x_1) * x1) / (dy * dy + x1 * x1);
          ViewPos.X = (y1 + local_f8 * dy) * 2.0 - savedpath[1].Z;
          ViewPos.Y = (x_1 + local_f8 * x1) * 2.0 - startpos.X;
        }
        else {
          dVar9 = vertex_t::fY((vertex_t *)local_a8._16_8_);
          dVar10 = vertex_t::fY((vertex_t *)local_a8._16_8_);
          ViewPos.Y = (dVar9 - startpos.X) + dVar10;
        }
      }
      else {
        dVar9 = vertex_t::fX((vertex_t *)local_a8._16_8_);
        dVar10 = vertex_t::fX((vertex_t *)local_a8._16_8_);
        ViewPos.X = (dVar9 - savedpath[1].Z) + dVar10;
      }
      line_t::Delta((line_t *)local_120);
      TVector2<double>::Angle((TVector2<double> *)(local_120 + 0x10));
      TAngle<double>::operator*((TAngle<double> *)(local_120 + 0x18),2.0);
      TAngle<double>::TAngle(&local_128,(TAngle<double> *)&startpos.Z);
      TAngle<double>::operator-
                ((TAngle<double> *)(local_120 + 0x20),(TAngle<double> *)(local_120 + 0x18));
      TAngle<double>::operator=(&ViewAngle,(TAngle<double> *)(local_120 + 0x20));
    }
    ViewSin = TAngle<double>::Sin(&ViewAngle);
    ViewCos = TAngle<double>::Cos(&ViewAngle);
    ViewTanSin = FocalTangent * ViewSin;
    ViewTanCos = FocalTangent * ViewCos;
    R_CopyStackedViewParameters();
    validcount = validcount + 1;
    uStack_1b0 = CurrentPortal;
    CurrentPortal = pds;
    R_ClearPlanes(false);
    R_ClearClipSegs((short)pds->x1,(short)pds->x2);
    WindowLeft = pds->x1;
    WindowRight = pds->x2;
    local_1b4 = (uint)MirrorFlags;
    if ((pds->mirror & 1U) != 0) {
      if ((MirrorFlags & 1) == 0) {
        MirrorFlags = MirrorFlags | 1;
      }
      else {
        operator~((EnumType)local_1b8);
        uVar6 = ::TFlags::operator_cast_to_unsigned_int(local_1b8);
        MirrorFlags = MirrorFlags & (ushort)uVar6;
      }
    }
    R_3D_EnterSkybox();
    CurrentPortalInSkybox = 0;
    iVar3 = pds->x1;
    psVar7 = TArray<short,_short>::operator[](&pds->ceilingclip,0);
    memcpy(ceilingclip + (long)iVar3 * 2,psVar7,(long)pds->len << 1);
    iVar3 = pds->x1;
    psVar7 = TArray<short,_short>::operator[](&pds->floorclip,0);
    memcpy(floorclip + (long)iVar3 * 2,psVar7,(long)pds->len << 1);
    InSubsector = 0;
    R_RenderBSPNode(nodes + (long)numnodes + -1);
    R_3D_ResetClip();
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&v1 + 4));
    if ((uVar6 == 0) && (camera != (AActor *)0x0)) {
      operator~((int)&vzp + RF_ONESIDED);
      TFlags<ActorRenderFlag,_unsigned_int>::operator&=
                (&camera->renderflags,(Self *)((long)&vzp + 4));
    }
    cycle_t::Clock(&PlaneCycles);
    R_DrawPlanes();
    R_DrawPortals();
    cycle_t::Unclock(&PlaneCycles);
    iVar3 = CurrentPortalUniq;
    uVar6 = TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg>::Size
                      ((TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg> *)WallPortals);
    for (; iVar4 = CurrentPortalUniq, (uint)v1 < uVar6; v1._0_4_ = (uint)v1 + 1) {
      pds_00 = TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg>::operator[]
                         ((TArray<swrenderer::PortalDrawseg,_swrenderer::PortalDrawseg> *)
                          WallPortals,(ulong)(uint)v1);
      R_EnterPortal(pds_00,depth + 1);
    }
    CurrentPortalUniq = iVar3;
    NetUpdate();
    cycle_t::Clock(&MaskedCycles);
    R_DrawMasked();
    cycle_t::Unclock(&MaskedCycles);
    NetUpdate();
    R_3D_LeaveSkybox();
    CurrentPortalUniq = iVar4;
    bVar2 = FBoolCVar::operator_cast_to_bool(&r_highlight_portals);
    if (bVar2) {
      R_HighlightPortal(pds);
    }
    CurrentPortal = (PortalDrawseg *)uStack_1b0;
    MirrorFlags = (ushort)local_1b4;
    TAngle<double>::operator=(&ViewAngle,(TAngle<double> *)&startpos.Z);
    TVector3<double>::operator=(&ViewPos,(TVector3<double> *)&savedpath[1].Z);
    TVector3<double>::operator=(ViewPath,(TVector3<double> *)&portalsAtStart);
    TVector3<double>::operator=(ViewPath + 1,(TVector3<double> *)&savedpath[0].Z);
  }
  else {
    iVar3 = BestColor((uint32 *)&GPalette,0,0,0,0,0xff);
    iVar4 = DCanvas::GetPitch(RenderTarget);
    for (Ybottom = pds->x1; Ybottom < pds->x2; Ybottom = Ybottom + 1) {
      if ((-1 < Ybottom) && (iVar5 = DCanvas::GetWidth(RenderTarget), Ybottom < iVar5)) {
        psVar7 = TArray<short,_short>::operator[](&pds->ceilingclip,(long)(Ybottom - pds->x1));
        startang.Degrees._4_4_ = (int)*psVar7;
        psVar7 = TArray<short,_short>::operator[](&pds->floorclip,(long)(Ybottom - pds->x1));
        sVar1 = *psVar7;
        pBVar8 = DCanvas::GetBuffer(RenderTarget);
        psStack_30 = (sector_t *)(pBVar8 + (long)(startang.Degrees._4_4_ * iVar4) + (long)Ybottom);
        for (; startang.Degrees._4_4_ <= sVar1; startang.Degrees._4_4_ = startang.Degrees._4_4_ + 1)
        {
          *(BYTE *)&psStack_30->planes[0].xform.xOffs = (BYTE)iVar3;
          psStack_30 = (sector_t *)((long)&psStack_30->planes[0].xform.xOffs + (long)iVar4);
        }
      }
    }
    bVar2 = FBoolCVar::operator_cast_to_bool(&r_highlight_portals);
    if (bVar2) {
      R_HighlightPortal(pds);
    }
  }
  return;
}

Assistant:

void R_EnterPortal (PortalDrawseg* pds, int depth)
{
	// [ZZ] check depth. fill portal with black if it's exceeding the visual recursion limit, and continue like nothing happened.
	if (depth >= r_portal_recursions)
	{
		BYTE color = (BYTE)BestColor((DWORD *)GPalette.BaseColors, 0, 0, 0, 0, 255);
		int spacing = RenderTarget->GetPitch();
		for (int x = pds->x1; x < pds->x2; x++)
		{
			if (x < 0 || x >= RenderTarget->GetWidth())
				continue;

			int Ytop = pds->ceilingclip[x-pds->x1];
			int Ybottom = pds->floorclip[x-pds->x1];

			BYTE *dest = RenderTarget->GetBuffer() + x + Ytop * spacing;

			for (int y = Ytop; y <= Ybottom; y++)
			{
				*dest = color;
				dest += spacing;
			}
		}

		if (r_highlight_portals)
			R_HighlightPortal(pds);

		return;
	}

	DAngle startang = ViewAngle;
	DVector3 startpos = ViewPos;
	DVector3 savedpath[2] = { ViewPath[0], ViewPath[1] };
	ActorRenderFlags savedvisibility = camera? camera->renderflags & RF_INVISIBLE : ActorRenderFlags::FromInt(0);

	CurrentPortalUniq++;

	unsigned int portalsAtStart = WallPortals.Size ();

	if (pds->mirror)
	{
		//vertex_t *v1 = ds->curline->v1;
		vertex_t *v1 = pds->src->v1;

		// Reflect the current view behind the mirror.
		if (pds->src->Delta().X == 0)
		{ // vertical mirror
			ViewPos.X = v1->fX() - startpos.X + v1->fX();
		}
		else if (pds->src->Delta().Y == 0)
		{ // horizontal mirror
			ViewPos.Y = v1->fY() - startpos.Y + v1->fY();
		}
		else
		{ // any mirror
			vertex_t *v2 = pds->src->v2;

			double dx = v2->fX() - v1->fX();
			double dy = v2->fY() - v1->fY();
			double x1 = v1->fX();
			double y1 = v1->fY();
			double x = startpos.X;
			double y = startpos.Y;

			// the above two cases catch len == 0
			double r = ((x - x1)*dx + (y - y1)*dy) / (dx*dx + dy*dy);

			ViewPos.X = (x1 + r * dx)*2 - x;
			ViewPos.Y = (y1 + r * dy)*2 - y;
		}
		ViewAngle = pds->src->Delta().Angle() * 2 - startang;
	}
	else
	{
		P_TranslatePortalXY(pds->src, ViewPos.X, ViewPos.Y);
		P_TranslatePortalZ(pds->src, ViewPos.Z);
		P_TranslatePortalAngle(pds->src, ViewAngle);
		P_TranslatePortalXY(pds->src, ViewPath[0].X, ViewPath[0].Y);
		P_TranslatePortalXY(pds->src, ViewPath[1].X, ViewPath[1].Y);

		if (!r_showviewer && camera && P_PointOnLineSidePrecise(ViewPath[0], pds->dst) != P_PointOnLineSidePrecise(ViewPath[1], pds->dst))
		{
			double distp = (ViewPath[0] - ViewPath[1]).Length();
			if (distp > EQUAL_EPSILON)
			{
				double dist1 = (ViewPos - ViewPath[0]).Length();
				double dist2 = (ViewPos - ViewPath[1]).Length();

				if (dist1 + dist2 < distp + 1)
				{
					camera->renderflags |= RF_INVISIBLE;
				}
			}
		}
	}

	ViewSin = ViewAngle.Sin();
	ViewCos = ViewAngle.Cos();

	ViewTanSin = FocalTangent * ViewSin;
	ViewTanCos = FocalTangent * ViewCos;

	R_CopyStackedViewParameters();

	validcount++;
	PortalDrawseg* prevpds = CurrentPortal;
	CurrentPortal = pds;

	R_ClearPlanes (false);
	R_ClearClipSegs (pds->x1, pds->x2);

	WindowLeft = pds->x1;
	WindowRight = pds->x2;
	
	// RF_XFLIP should be removed before calling the root function
	int prevmf = MirrorFlags;
	if (pds->mirror)
	{
		if (MirrorFlags & RF_XFLIP)
			MirrorFlags &= ~RF_XFLIP;
		else MirrorFlags |= RF_XFLIP;
	}

	// some portals have height differences, account for this here
	R_3D_EnterSkybox(); // push 3D floor height map
	CurrentPortalInSkybox = false; // first portal in a skybox should set this variable to false for proper clipping in skyboxes.

	// first pass, set clipping
	memcpy (ceilingclip + pds->x1, &pds->ceilingclip[0], pds->len*sizeof(*ceilingclip));
	memcpy (floorclip + pds->x1, &pds->floorclip[0], pds->len*sizeof(*floorclip));

	InSubsector = NULL;
	R_RenderBSPNode (nodes + numnodes - 1);
	R_3D_ResetClip(); // reset clips (floor/ceiling)
	if (!savedvisibility && camera) camera->renderflags &= ~RF_INVISIBLE;

	PlaneCycles.Clock();
	R_DrawPlanes ();
	R_DrawPortals ();
	PlaneCycles.Unclock();

	double vzp = ViewPos.Z;

	int prevuniq = CurrentPortalUniq;
	// depth check is in another place right now
	unsigned int portalsAtEnd = WallPortals.Size ();
	for (; portalsAtStart < portalsAtEnd; portalsAtStart++)
	{
		R_EnterPortal (&WallPortals[portalsAtStart], depth + 1);
	}
	int prevuniq2 = CurrentPortalUniq;
	CurrentPortalUniq = prevuniq;

	NetUpdate();

	MaskedCycles.Clock(); // [ZZ] count sprites in portals/mirrors along with normal ones.
	R_DrawMasked ();	  //      this is required since with portals there often will be cases when more than 80% of the view is inside a portal.
	MaskedCycles.Unclock();

	NetUpdate();

	R_3D_LeaveSkybox(); // pop 3D floor height map
	CurrentPortalUniq = prevuniq2;

	// draw a red line around a portal if it's being highlighted
	if (r_highlight_portals)
		R_HighlightPortal(pds);

	CurrentPortal = prevpds;
	MirrorFlags = prevmf;
	ViewAngle = startang;
	ViewPos = startpos;
	ViewPath[0] = savedpath[0];
	ViewPath[1] = savedpath[1];
}